

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::PlotVLines<unsigned_short>
               (char *label_id,unsigned_short *xs,int count,int offset,int stride)

{
  double dVar1;
  ushort uVar2;
  uint uVar3;
  ImPlotContext *pIVar4;
  bool bVar5;
  ImU32 col;
  ImDrawList *DrawList;
  int iVar6;
  int iVar7;
  double dVar8;
  double dVar9;
  GetterXsYRef<unsigned_short> get_max;
  GetterXsYRef<unsigned_short> get_min;
  ImPlotLimits lims;
  TransformerLinLin local_94;
  GetterXsYRef<unsigned_short> local_90;
  GetterXsYRef<unsigned_short> local_70;
  ImPlotLimits local_50;
  
  iVar7 = 0;
  bVar5 = BeginItem(label_id,0);
  if (bVar5) {
    GetPlotLimits(&local_50,-1);
    pIVar4 = GImPlot;
    local_70.YRef = local_50.Y.Min;
    if (count != 0) {
      iVar7 = (offset % count + count) % count;
    }
    local_90.YRef = local_50.Y.Max;
    if (count == 0) {
      local_90.Offset = 0;
    }
    else {
      local_90.Offset = (offset % count + count) % count;
    }
    if ((0 < count) && (GImPlot->FitThisFrame != false)) {
      uVar3 = (GImPlot->CurrentPlot->XAxis).Flags;
      iVar6 = 0;
      do {
        uVar2 = *(ushort *)
                 ((long)xs + (long)(((iVar7 + iVar6) % count + count) % count) * (long)stride);
        if ((uVar2 != 0) || ((uVar3 & 0x20) == 0)) {
          dVar8 = (double)uVar2;
          dVar1 = (pIVar4->ExtentsX).Min;
          dVar9 = dVar8;
          if (dVar1 <= dVar8) {
            dVar9 = dVar1;
          }
          (pIVar4->ExtentsX).Min = dVar9;
          dVar1 = (pIVar4->ExtentsX).Max;
          if (dVar8 <= dVar1) {
            dVar8 = dVar1;
          }
          (pIVar4->ExtentsX).Max = dVar8;
        }
        iVar6 = iVar6 + 1;
      } while (count != iVar6);
    }
    local_90.Xs = xs;
    local_90.Count = count;
    local_90.Stride = stride;
    local_70.Xs = xs;
    local_70.Count = count;
    local_70.Offset = iVar7;
    local_70.Stride = stride;
    DrawList = GetPlotDrawList();
    if ((pIVar4->NextItemData).RenderLine == true) {
      col = ImGui::GetColorU32((pIVar4->NextItemData).Colors);
      iVar7 = GImPlot->CurrentPlot->CurrentYAxis;
      switch(GImPlot->Scales[iVar7]) {
      case 0:
        local_94.YAxis = iVar7;
        RenderLineSegments<ImPlot::GetterXsYRef<unsigned_short>,ImPlot::GetterXsYRef<unsigned_short>,ImPlot::TransformerLinLin>
                  (&local_70,&local_90,&local_94,DrawList,(pIVar4->NextItemData).LineWeight,col);
        break;
      case 1:
        local_94.YAxis = iVar7;
        RenderLineSegments<ImPlot::GetterXsYRef<unsigned_short>,ImPlot::GetterXsYRef<unsigned_short>,ImPlot::TransformerLogLin>
                  (&local_70,&local_90,(TransformerLogLin *)&local_94,DrawList,
                   (pIVar4->NextItemData).LineWeight,col);
        break;
      case 2:
        local_94.YAxis = iVar7;
        RenderLineSegments<ImPlot::GetterXsYRef<unsigned_short>,ImPlot::GetterXsYRef<unsigned_short>,ImPlot::TransformerLinLog>
                  (&local_70,&local_90,(TransformerLinLog *)&local_94,DrawList,
                   (pIVar4->NextItemData).LineWeight,col);
        break;
      case 3:
        local_94.YAxis = iVar7;
        RenderLineSegments<ImPlot::GetterXsYRef<unsigned_short>,ImPlot::GetterXsYRef<unsigned_short>,ImPlot::TransformerLogLog>
                  (&local_70,&local_90,(TransformerLogLog *)&local_94,DrawList,
                   (pIVar4->NextItemData).LineWeight,col);
      }
    }
    pIVar4 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar4->NextItemData);
    pIVar4->PreviousItem = pIVar4->CurrentItem;
    pIVar4->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

void PlotVLines(const char* label_id, const T* xs, int count, int offset, int stride) {
    if (BeginItem(label_id, ImPlotCol_Line)) {
        const ImPlotLimits lims = GetPlotLimits();
        GetterXsYRef<T> get_min(xs,lims.Y.Min,count,offset,stride);
        GetterXsYRef<T> get_max(xs,lims.Y.Max,count,offset,stride);
        if (FitThisFrame()) {
            for (int i = 0; i < get_min.Count; ++i)
                FitPointX(get_min(i).x);
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        // render stems
        if (s.RenderLine) {
            const ImU32 col_line = ImGui::GetColorU32(s.Colors[ImPlotCol_Line]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderLineSegments(get_min, get_max, TransformerLinLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLin: RenderLineSegments(get_min, get_max, TransformerLogLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LinLog: RenderLineSegments(get_min, get_max, TransformerLinLog(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLog: RenderLineSegments(get_min, get_max, TransformerLogLog(), DrawList, s.LineWeight, col_line); break;
            }
        }
        EndItem();
    }
}